

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O3

unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_> __thiscall
enact::Parser::expectTypenamePrecParametric(Parser *this,string *msg,bool emptyAllowed)

{
  char *pcVar1;
  ParametricTypename *this_00;
  pointer *__ptr_2;
  pointer *__ptr;
  size_type __dnew;
  vector<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
  parameterTypenames;
  _Head_base<0UL,_const_enact::Typename_*,_false> local_88;
  undefined1 local_80 [8];
  string local_78;
  _Head_base<0UL,_const_enact::Typename_*,_false> local_50;
  vector<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
  local_48;
  
  expectTypenamePrecPrimary(this,msg,emptyAllowed);
  if (*(int *)&msg[7]._M_dataplus._M_p == 4) {
    local_50._M_head_impl = (Typename *)this;
    advance((Parser *)msg);
    local_48.
    super__Vector_base<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_48.
    super__Vector_base<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48.
    super__Vector_base<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pcVar1 = local_80 + 0x18;
    while( true ) {
      local_88._M_head_impl = (Typename *)0x27;
      local_78._M_dataplus._M_p = pcVar1;
      local_78._M_dataplus._M_p =
           (pointer)std::__cxx11::string::_M_create((ulong *)(local_80 + 8),(ulong)&local_88);
      local_78.field_2._M_allocated_capacity = (size_type)local_88._M_head_impl;
      builtin_strncpy(local_78._M_dataplus._M_p,"Expected typename parameters after \'[\'.",0x27);
      local_78._M_string_length = (size_type)local_88._M_head_impl;
      local_78._M_dataplus._M_p[(long)local_88._M_head_impl] = '\0';
      expectTypenamePrecFunction((Parser *)local_80,msg,SUB81(local_80 + 8,0));
      std::
      vector<std::unique_ptr<enact::Typename_const,std::default_delete<enact::Typename_const>>,std::allocator<std::unique_ptr<enact::Typename_const,std::default_delete<enact::Typename_const>>>>
      ::
      emplace_back<std::unique_ptr<enact::Typename_const,std::default_delete<enact::Typename_const>>>
                ((vector<std::unique_ptr<enact::Typename_const,std::default_delete<enact::Typename_const>>,std::allocator<std::unique_ptr<enact::Typename_const,std::default_delete<enact::Typename_const>>>>
                  *)&local_48,
                 (unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_> *)
                 local_80);
      if (local_80 != (undefined1  [8])0x0) {
        (**(code **)((((string *)local_80)->_M_dataplus)._M_p + 8))();
      }
      local_80 = (undefined1  [8])0x0;
      if (local_78._M_dataplus._M_p != pcVar1) {
        operator_delete(local_78._M_dataplus._M_p,
                        (ulong)(local_78.field_2._M_allocated_capacity + 1));
      }
      if (*(int *)&msg[7]._M_dataplus._M_p != 9) break;
      advance((Parser *)msg);
    }
    local_88._M_head_impl = (Typename *)0x27;
    local_78._M_dataplus._M_p = pcVar1;
    local_78._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)(local_80 + 8),(ulong)&local_88);
    local_78.field_2._M_allocated_capacity = (size_type)local_88._M_head_impl;
    builtin_strncpy(local_78._M_dataplus._M_p,"Expected \']\' after typename parameters.",0x27);
    local_78._M_string_length = (size_type)local_88._M_head_impl;
    local_78._M_dataplus._M_p[(long)local_88._M_head_impl] = '\0';
    expect((Parser *)msg,RIGHT_SQUARE,(string *)(local_80 + 8));
    if (local_78._M_dataplus._M_p != pcVar1) {
      operator_delete(local_78._M_dataplus._M_p,(ulong)(local_78.field_2._M_allocated_capacity + 1))
      ;
    }
    this = (Parser *)local_50._M_head_impl;
    this_00 = (ParametricTypename *)operator_new(0x48);
    local_88._M_head_impl = (Typename *)((Typename *)this)->_vptr_Typename;
    ((Typename *)this)->_vptr_Typename = (_func_int **)0x0;
    local_78._M_dataplus._M_p =
         (pointer)local_48.
                  super__Vector_base<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    local_78._M_string_length =
         (size_type)
         local_48.
         super__Vector_base<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_78.field_2._M_allocated_capacity =
         (size_type)
         local_48.
         super__Vector_base<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_48.
    super__Vector_base<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_48.
    super__Vector_base<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_48.
    super__Vector_base<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    ParametricTypename::ParametricTypename
              (this_00,(unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>
                        *)&local_88,
               (vector<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
                *)(local_80 + 8));
    std::
    vector<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
    ::~vector((vector<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
               *)(local_80 + 8));
    if (local_88._M_head_impl != (Typename *)0x0) {
      (*(local_88._M_head_impl)->_vptr_Typename[1])();
    }
    ((Typename *)this)->_vptr_Typename = (_func_int **)this_00;
    std::
    vector<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
    ::~vector(&local_48);
  }
  return (__uniq_ptr_data<const_enact::Typename,_std::default_delete<const_enact::Typename>,_true,_true>
          )(tuple<const_enact::Typename_*,_std::default_delete<const_enact::Typename>_>)this;
}

Assistant:

std::unique_ptr<const Typename> Parser::expectTypenamePrecParametric(const std::string &msg, bool emptyAllowed) {
        std::unique_ptr<const Typename> typename_ = expectTypenamePrecPrimary(msg, emptyAllowed);

        if (consume(TokenType::LEFT_SQUARE)) {
            std::vector<std::unique_ptr<const Typename>> parameterTypenames;

            do {
                parameterTypenames.push_back(expectTypename("Expected typename parameters after '['."));
            } while (consume(TokenType::COMMA));
            expect(TokenType::RIGHT_SQUARE, "Expected ']' after typename parameters.");

            typename_ = std::make_unique<ParametricTypename>(std::move(typename_), std::move(parameterTypenames));
        }

        return typename_;
    }